

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int32_t ucstrTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                        UErrorCode *pErrorCode)

{
  ulong uVar1;
  int iVar2;
  UChar *pUVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int32_t length;
  ulong uVar8;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < destCapacity) {
      if ((start <= limit) && (dest != (UChar *)0x0 || destCapacity == 0)) {
        ucstrTextAccess(ut,start,'\x01');
        pUVar3 = ut->chunkContents;
        uVar7 = (uint)ut->a;
        iVar2 = ut->chunkOffset;
        lVar6 = (long)iVar2;
        if ((int)uVar7 < 0) {
          uVar5 = 0x7fffffff;
          if ((ulong)limit < 0x7fffffff) {
            uVar5 = limit;
          }
        }
        else {
          uVar5 = (ulong)(uVar7 & 0x7fffffff);
          if ((ulong)limit <= (ulong)(uVar7 & 0x7fffffff)) {
            uVar5 = limit;
          }
        }
        uVar8 = 0;
        uVar5 = uVar5 & 0xffffffff;
        if (limit < 0) {
          uVar5 = uVar8;
        }
        do {
          uVar1 = lVar6 + uVar8;
          if ((long)uVar5 <= (long)uVar1) {
            uVar5 = (ulong)(uint)(iVar2 + (int)uVar8);
LAB_0035aa4e:
            length = (int32_t)uVar8;
            uVar4 = (uint)uVar5;
            if ((((0 < (int)uVar4) && (uVar4 < uVar7)) && ((pUVar3[uVar5 - 1] & 0xfc00U) == 0xd800))
               && ((pUVar3[uVar5] & 0xfc00U) == 0xdc00)) {
              if (length < destCapacity) {
                lVar6 = (long)length;
                length = length + 1;
                dest[lVar6] = pUVar3[uVar5];
              }
              uVar4 = uVar4 + 1;
            }
            if (ut->chunkNativeLimit < (long)(int)uVar4) {
              ucstrTextAccess(ut,(long)(int)uVar4,'\x01');
            }
            else {
              ut->chunkOffset = uVar4;
            }
            u_terminateUChars_63(dest,destCapacity,length,pErrorCode);
            return length;
          }
          if (((int)uVar7 < 0) && (pUVar3[lVar6 + uVar8] == L'\0')) {
            ut->a = uVar1;
            ut->chunkNativeLimit = uVar1;
            uVar7 = (uint)uVar1;
            ut->chunkLength = uVar7;
            ut->nativeIndexingLimit = uVar7;
            uVar5 = uVar1 & 0xffffffff;
            goto LAB_0035aa4e;
          }
          if (uVar8 < (uint)destCapacity) {
            dest[uVar8] = pUVar3[lVar6 + uVar8];
          }
          else if (-1 < (int)uVar7) {
            uVar8 = (ulong)(uint)((int)uVar5 - iVar2);
            goto LAB_0035aa4e;
          }
          uVar8 = uVar8 + 1;
        } while( true );
      }
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

static int32_t U_CALLCONV
ucstrTextExtract(UText *ut,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode)
{
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0) || start>limit) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //const UChar *s=(const UChar *)ut->context;
    int32_t si, di;

    int32_t start32;
    int32_t limit32;

    // Access the start.  Does two things we need:
    //   Pins 'start' to the length of the string, if it came in out-of-bounds.
    //   Snaps 'start' to the beginning of a code point.
    ucstrTextAccess(ut, start, TRUE);
    const UChar *s=ut->chunkContents;
    start32 = ut->chunkOffset;

    int32_t strLength=(int32_t)ut->a;
    if (strLength >= 0) {
        limit32 = pinIndex(limit, strLength);
    } else {
        limit32 = pinIndex(limit, INT32_MAX);
    }
    di = 0;
    for (si=start32; si<limit32; si++) {
        if (strLength<0 && s[si]==0) {
            // Just hit the end of a null-terminated string.
            ut->a = si;               // set string length for this UText
            ut->chunkNativeLimit    = si;
            ut->chunkLength         = si;
            ut->nativeIndexingLimit = si;
            strLength               = si;
            limit32                 = si;
            break;
        }
        U_ASSERT(di>=0); /* to ensure di never exceeds INT32_MAX, which must not happen logically */
        if (di<destCapacity) {
            // only store if there is space.
            dest[di] = s[si];
        } else {
            if (strLength>=0) {
                // We have filled the destination buffer, and the string length is known.
                //  Cut the loop short.  There is no need to scan string termination.
                di = limit32 - start32;
                si = limit32;
                break;
            }
        }
        di++;
    }

    // If the limit index points to a lead surrogate of a pair,
    //   add the corresponding trail surrogate to the destination.
    if (si>0 && U16_IS_LEAD(s[si-1]) &&
            ((si<strLength || strLength<0)  && U16_IS_TRAIL(s[si])))
    {
        if (di<destCapacity) {
            // store only if there is space in the output buffer.
            dest[di++] = s[si];
        }
        si++;
    }

    // Put iteration position at the point just following the extracted text
    if (si <= ut->chunkNativeLimit) {
        ut->chunkOffset = si;
    } else {
        ucstrTextAccess(ut, si, TRUE);
    }

    // Add a terminating NUL if space in the buffer permits,
    // and set the error status as required.
    u_terminateUChars(dest, destCapacity, di, pErrorCode);
    return di;
}